

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O3

bool __thiscall CEditor::PopupSelectImage(CEditor *this,void *pContext,CUIRect View)

{
  undefined4 uVar1;
  CEditorImage **ppCVar2;
  CEditorImage *pCVar3;
  undefined4 uVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  byte bVar8;
  char *pText;
  long lVar9;
  int *pID;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long in_FS_OFFSET;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  CUIRect Button;
  CUIRect ButtonBar;
  CUIRect local_78;
  CUIRect local_68;
  CUIRect local_58;
  CUIRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = View;
  CUIRect::VSplitLeft(&local_48,80.0,&local_58,&local_48);
  CUIRect::Margin(&local_48,10.0,&local_68);
  iVar7 = (this->m_Map).m_lImages.num_elements;
  uVar12 = g_SelectImageCurrent;
  if (iVar7 < 0) {
    bVar8 = 0;
  }
  else {
    lVar11 = -1;
    lVar9 = -8;
    bVar8 = 0;
    do {
      CUIRect::HSplitTop(&local_58,12.0,&local_78,&local_58);
      CUIRect::HSplitTop(&local_58,2.0,(CUIRect *)0x0,&local_58);
      bVar6 = CUIRect::Inside(&local_78,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY);
      uVar10 = (uint)lVar11;
      uVar5 = uVar10;
      if (!bVar6) {
        uVar5 = uVar12;
      }
      uVar12 = uVar5;
      pID = &PopupSelectImage::s_NoImageButton;
      pText = "None";
      if (lVar11 != -1) {
        ppCVar2 = (this->m_Map).m_lImages.list;
        pID = (int *)((long)ppCVar2 + lVar9);
        pText = ppCVar2[lVar11]->m_aName;
      }
      iVar7 = DoButton_MenuItem(this,pID,pText,(uint)(uVar10 == g_SelectImageCurrent),&local_78,0,
                                (char *)0x0);
      if (iVar7 != 0) {
        g_SelectImageSelected = uVar10;
        iVar7 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[0xb])();
        bVar8 = bVar8 | (byte)iVar7;
      }
      lVar11 = lVar11 + 1;
      iVar7 = (this->m_Map).m_lImages.num_elements;
      lVar9 = lVar9 + 8;
    } while (lVar11 < iVar7);
  }
  if (-1 < (int)uVar12 && (int)uVar12 < iVar7) {
    if (local_68.w <= local_68.h) {
      local_68.h = local_68.w;
    }
    pCVar3 = (this->m_Map).m_lImages.list[uVar12];
    uVar1 = (pCVar3->super_CImageInfo).m_Width;
    uVar4 = (pCVar3->super_CImageInfo).m_Height;
    iVar7 = uVar4;
    if ((int)uVar4 < (int)uVar1) {
      iVar7 = uVar1;
    }
    auVar14._0_4_ = (float)(int)uVar1;
    auVar14._4_4_ = (float)(int)uVar4;
    auVar14._8_8_ = 0;
    auVar15._4_4_ = (float)iVar7;
    auVar15._0_4_ = (float)iVar7;
    auVar15._8_8_ = 0;
    auVar15 = divps(auVar14,auVar15);
    fVar13 = local_68.h * auVar15._0_4_;
    local_68.h = local_68.h * auVar15._4_4_;
    local_68.w = fVar13;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
              (this->m_pGraphics,(ulong)(uint)(pCVar3->m_Texture).m_Id);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0xb])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
    local_78.x = local_68.x;
    local_78.y = local_68.y;
    local_78.w = local_68.w;
    local_78.h = local_68.h;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_78,1);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[10])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar8 & 1);
}

Assistant:

bool CEditor::PopupSelectImage(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect ButtonBar, ImageView;
	View.VSplitLeft(80.0f, &ButtonBar, &View);
	View.Margin(10.0f, &ImageView);

	int ShowImage = g_SelectImageCurrent;
	bool ClosePopup = false;

	static int s_NoImageButton;
	for(int i = -1; i < pEditor->m_Map.m_lImages.size(); i++)
	{
		CUIRect Button;
		ButtonBar.HSplitTop(12.0f, &Button, &ButtonBar);
		ButtonBar.HSplitTop(2.0f, 0, &ButtonBar);

		if(pEditor->UI()->MouseInside(&Button))
			ShowImage = i;

		if(pEditor->DoButton_MenuItem(i == -1 ? (void *)&s_NoImageButton : &pEditor->m_Map.m_lImages[i], i == -1 ? "None" : pEditor->m_Map.m_lImages[i]->m_aName, i == g_SelectImageCurrent, &Button))
		{
			g_SelectImageSelected = i;
			ClosePopup |= pEditor->Input()->MouseDoubleClick();
		}
	}

	if(ShowImage >= 0 && ShowImage < pEditor->m_Map.m_lImages.size())
	{
		if(ImageView.h < ImageView.w)
			ImageView.w = ImageView.h;
		else
			ImageView.h = ImageView.w;
		float Max = (float)(maximum(pEditor->m_Map.m_lImages[ShowImage]->m_Width, pEditor->m_Map.m_lImages[ShowImage]->m_Height));
		ImageView.w *= pEditor->m_Map.m_lImages[ShowImage]->m_Width/Max;
		ImageView.h *= pEditor->m_Map.m_lImages[ShowImage]->m_Height/Max;
		pEditor->Graphics()->TextureSet(pEditor->m_Map.m_lImages[ShowImage]->m_Texture);
		pEditor->Graphics()->BlendNormal();
		pEditor->Graphics()->WrapClamp();
		pEditor->Graphics()->QuadsBegin();
		IGraphics::CQuadItem QuadItem(ImageView.x, ImageView.y, ImageView.w, ImageView.h);
		pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);
		pEditor->Graphics()->QuadsEnd();
		pEditor->Graphics()->WrapNormal();
	}

	return ClosePopup;
}